

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetLinkerLanguage(string *__return_storage_ptr__,cmTarget *this,string *config)

{
  LinkClosure *pLVar1;
  string *config_local;
  cmTarget *this_local;
  
  pLVar1 = GetLinkClosure(this,config);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pLVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetLinkerLanguage(const std::string& config) const
{
  return this->GetLinkClosure(config)->LinkerLanguage;
}